

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# passes.hpp
# Opt level: O0

void Pass5::run(Program *program,TailCallData *data)

{
  bool bVar1;
  Block *block;
  undefined1 local_50 [8];
  Pass5 pass5;
  Function *function;
  Iterator __end1;
  Iterator __begin1;
  Program *__range1;
  TailCallData *data_local;
  Program *program_local;
  
  __end1 = Program::begin(program);
  function = (Function *)Program::end(program);
  while( true ) {
    bVar1 = Program::Iterator::operator!=(&__end1,(Iterator *)&function);
    if (!bVar1) break;
    pass5.data = (TailCallData *)Program::Iterator::operator*(&__end1);
    Pass5((Pass5 *)local_50,(Function *)pass5.data,data);
    block = Function::get_block((Function *)pass5.data);
    evaluate((Pass5 *)local_50,block);
    Program::Iterator::operator++(&__end1);
  }
  return;
}

Assistant:

static void run(const Program& program, TailCallData& data) {
		for (const Function* function: program) {
			Pass5 pass5(function, data);
			pass5.evaluate(function->get_block());
		}
	}